

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::btQuantizedBvh(btQuantizedBvh *this,btQuantizedBvh *self,bool param_3)

{
  undefined8 uVar1;
  long in_RSI;
  undefined8 *in_RDI;
  btAlignedObjectArray<btOptimizedBvhNode> *in_stack_ffffffffffffffb0;
  btAlignedObjectArray<btBvhSubtreeInfo> *this_00;
  
  *in_RDI = &PTR__btQuantizedBvh_002e23d8;
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  in_RDI[1] = *(undefined8 *)(in_RSI + 8);
  in_RDI[2] = uVar1;
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
  in_RDI[4] = uVar1;
  uVar1 = *(undefined8 *)(in_RSI + 0x30);
  in_RDI[5] = *(undefined8 *)(in_RSI + 0x28);
  in_RDI[6] = uVar1;
  *(undefined4 *)(in_RDI + 7) = 0x11c;
  btAlignedObjectArray<btOptimizedBvhNode>::btAlignedObjectArray(in_stack_ffffffffffffffb0);
  btAlignedObjectArray<btOptimizedBvhNode>::btAlignedObjectArray(in_stack_ffffffffffffffb0);
  btAlignedObjectArray<btQuantizedBvhNode>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuantizedBvhNode> *)in_stack_ffffffffffffffb0);
  this_00 = (btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0x15);
  btAlignedObjectArray<btQuantizedBvhNode>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuantizedBvhNode> *)this_00);
  btAlignedObjectArray<btBvhSubtreeInfo>::btAlignedObjectArray(this_00);
  return;
}

Assistant:

btQuantizedBvh::btQuantizedBvh(btQuantizedBvh &self, bool /* ownsMemory */) :
m_bvhAabbMin(self.m_bvhAabbMin),
m_bvhAabbMax(self.m_bvhAabbMax),
m_bvhQuantization(self.m_bvhQuantization),
m_bulletVersion(BT_BULLET_VERSION)
{

}